

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.hh
# Opt level: O0

GenericDatum * __thiscall avro::Node::defaultValueAt(Node *this,int index)

{
  undefined8 uVar1;
  int *in_stack_fffffffffffffee8;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  format *in_stack_ffffffffffffff28;
  Exception *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff58;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  
  uVar1 = __cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::operator%
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  Exception::Exception(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  __cxa_throw(uVar1,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

virtual const GenericDatum& defaultValueAt(int index) {
        throw Exception(boost::format("No default value at: %1%") % index);
    }